

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

int katherine_get_sensor_temperature(katherine_device_t *device,float *temperature)

{
  float local_2c [2];
  char crd [8];
  int res;
  float *temperature_local;
  katherine_device_t *device_local;
  
  unique0x10000044 = temperature;
  crd._0_4_ = katherine_cmd_get_sensor_temperature(&device->control_socket);
  if ((crd._0_4_ == 0) &&
     (crd._0_4_ = katherine_cmd_wait_ack_crd(&device->control_socket,(char *)local_2c),
     crd._0_4_ == 0)) {
    *stack0xffffffffffffffe0 = local_2c[0];
    device_local._4_4_ = 0;
  }
  else {
    device_local._4_1_ = crd[0];
    device_local._5_1_ = crd[1];
    device_local._6_1_ = crd[2];
    device_local._7_1_ = crd[3];
  }
  return device_local._4_4_;
}

Assistant:

int
katherine_get_sensor_temperature(katherine_device_t *device, float *temperature)
{
    int res;

    res = katherine_cmd_get_sensor_temperature(&device->control_socket);
    if (res) goto err;

    char crd[8];
    res = katherine_cmd_wait_ack_crd(&device->control_socket, crd);
    if (res) goto err;

    *temperature = *(float*) crd;
    return 0;

err:
    return res;
}